

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O2

Reals __thiscall Omega_h::repeat_vector<1>(Omega_h *this,LO n,Vector<1> v)

{
  void *extraout_RDX;
  Reals RVar1;
  Write<double> vs;
  type f;
  allocator local_59;
  Write<double> local_58;
  Few<double,_1> local_48;
  Write<signed_char> local_40;
  string local_30;
  
  local_48.array_[0] = (double  [1])(double  [1])v.super_Few<double,_1>.array_[0];
  std::__cxx11::string::string((string *)&local_30,"",&local_59);
  Write<double>::Write(&local_58,n,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  Write<double>::Write((Write<double> *)&local_30,&local_58);
  local_30.field_2._M_allocated_capacity = (size_type)local_48.array_[0];
  parallel_for<Omega_h::repeat_vector<1>(int,Omega_h::Vector<1>)::_lambda(int)_1_>
            (n,(type *)&local_30,"repeat_vector");
  Write<double>::Write(&local_40,(Write<signed_char> *)&local_58);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_40);
  Write<double>::~Write((Write<double> *)&local_40);
  Write<double>::~Write((Write<double> *)&local_30);
  Write<double>::~Write(&local_58);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals repeat_vector(LO n, Vector<dim> v) {
  Write<Real> vs(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) { set_vector(vs, i, v); };
  parallel_for(n, f, "repeat_vector");
  return vs;
}